

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

void __thiscall
chrono::ChArchiveIn::in<chrono::ChAparticle*>
          (ChArchiveIn *this,
          ChNameValue<std::vector<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>_>
          *bVal)

{
  vector<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_> *pvVar1;
  pointer ppCVar2;
  size_t i;
  ulong uVar3;
  ChAparticle *element;
  size_t arraysize;
  char idname [20];
  ChAparticle *local_70;
  size_type local_68;
  ChNameValue<chrono::ChAparticle_*> local_60;
  char local_48 [24];
  
  pvVar1 = bVal->_value;
  ppCVar2 = (pvVar1->
            super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if ((pvVar1->super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>).
      _M_impl.super__Vector_impl_data._M_finish != ppCVar2) {
    (pvVar1->super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>).
    _M_impl.super__Vector_impl_data._M_finish = ppCVar2;
  }
  (**(code **)(*(long *)this + 0x70))(this,bVal->_name,&local_68);
  std::vector<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>::resize
            (bVal->_value,local_68);
  for (uVar3 = 0; uVar3 < local_68; uVar3 = uVar3 + 1) {
    sprintf(local_48,"%lu",uVar3);
    local_60._flags = '\0';
    local_60._name = local_48;
    local_60._value = &local_70;
    in<chrono::ChAparticle>(this,&local_60);
    (bVal->_value->super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>
    )._M_impl.super__Vector_impl_data._M_start[uVar3] = local_70;
    (**(code **)(*(long *)this + 0x78))(this,bVal->_name);
  }
  (**(code **)(*(long *)this + 0x80))(this,bVal->_name);
  return;
}

Assistant:

void in     (ChNameValue< std::vector<T> > bVal) {
          bVal.value().clear();
          size_t arraysize;
          this->in_array_pre(bVal.name(), arraysize);
          bVal.value().resize(arraysize);
          for (size_t i = 0; i<arraysize; ++i)
          {
              char idname[20];
              sprintf(idname, "%lu", (unsigned long)i);
              T element;
              ChNameValue< T > array_val(idname, element);
              this->in (array_val);
              bVal.value()[i]=element;
              this->in_array_between(bVal.name());
          }
          this->in_array_end(bVal.name());
      }